

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

monster * monster_target_monster(effect_handler_context_t_conflict *context)

{
  monster_conflict *pmVar1;
  monster *t_mon;
  monster *mon;
  effect_handler_context_t_conflict *context_local;
  
  if ((context->origin).what == SRC_MONSTER) {
    pmVar1 = cave_monster(cave,(context->origin).which.monster);
    if (pmVar1 == (monster_conflict *)0x0) {
      return (monster *)0x0;
    }
    if (L'\0' < (pmVar1->target).midx) {
      pmVar1 = cave_monster(cave,(pmVar1->target).midx);
      if (pmVar1 != (monster_conflict *)0x0) {
        return (monster *)pmVar1;
      }
      __assert_fail("t_mon",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/effect-handler-general.c"
                    ,0x68,"struct monster *monster_target_monster(effect_handler_context_t *)");
    }
  }
  return (monster *)0x0;
}

Assistant:

struct monster *monster_target_monster(effect_handler_context_t *context)
{
	if (context->origin.what == SRC_MONSTER) {
		struct monster *mon = cave_monster(cave, context->origin.which.monster);
		if (!mon) return NULL;
		if (mon->target.midx > 0) {
			struct monster *t_mon = cave_monster(cave, mon->target.midx);
			assert(t_mon);
			return t_mon;
		}
	}
	return NULL;
}